

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.hpp
# Opt level: O2

int __thiscall
websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>::init
          (endpoint<websocketpp::config::asio::transport_config> *this,EVP_PKEY_CTX *ctx)

{
  long lVar1;
  size_t in_RCX;
  error_code eVar2;
  shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>
  sStack_78;
  function<void_(std::weak_ptr<void>)> local_68;
  function<void_(std::weak_ptr<void>)> local_48;
  
  log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
            ((this->m_alog).
             super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,0x400,"transport::asio::init",in_RCX);
  std::
  static_pointer_cast<websocketpp::transport::asio::basic_socket::connection,websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>>
            (&sStack_78);
  basic_socket::endpoint::init(&this->super_socket_type,(EVP_PKEY_CTX *)&sStack_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sStack_78.
              super___shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  eVar2 = connection<websocketpp::config::asio::transport_config>::init_asio
                    (*(connection<websocketpp::config::asio::transport_config> **)ctx,
                     this->m_io_service);
  if (eVar2._M_value == 0) {
    lVar1 = *(long *)ctx;
    std::function<void_(std::weak_ptr<void>)>::function(&local_48,&this->m_tcp_pre_init_handler);
    std::function<void_(std::weak_ptr<void>)>::operator=
              ((function<void_(std::weak_ptr<void>)> *)(lVar1 + 0x100),&local_48);
    std::_Function_base::~_Function_base(&local_48.super__Function_base);
    lVar1 = *(long *)ctx;
    std::function<void_(std::weak_ptr<void>)>::function(&local_68,&this->m_tcp_post_init_handler);
    std::function<void_(std::weak_ptr<void>)>::operator=
              ((function<void_(std::weak_ptr<void>)> *)(lVar1 + 0x120),&local_68);
    std::_Function_base::~_Function_base(&local_68.super__Function_base);
    std::_V2::system_category();
  }
  return eVar2._M_value;
}

Assistant:

lib::error_code init(transport_con_ptr tcon) {
        m_alog->write(log::alevel::devel, "transport::asio::init");

        // Initialize the connection socket component
        socket_type::init(lib::static_pointer_cast<socket_con_type,
            transport_con_type>(tcon));

        lib::error_code ec;

        ec = tcon->init_asio(m_io_service);
        if (ec) {return ec;}

        tcon->set_tcp_pre_init_handler(m_tcp_pre_init_handler);
        tcon->set_tcp_post_init_handler(m_tcp_post_init_handler);

        return lib::error_code();
    }